

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O2

uint __thiscall CScript::GetSigOpCount(CScript *this,bool fAccurate)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  CScript *pCVar4;
  uint uVar5;
  uint uVar6;
  opcodetype opcode_00;
  long in_FS_OFFSET;
  opcodetype opcode;
  const_iterator pc;
  opcodetype local_44;
  const_iterator local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = (this->super_CScriptBase)._size;
  pCVar4 = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
  local_40.ptr = (uchar *)pCVar4;
  if (uVar6 < 0x1d) {
    local_40.ptr = (uchar *)this;
  }
  uVar5 = 0;
  opcode_00 = OP_INVALIDOPCODE;
  while( true ) {
    uVar2 = uVar6 - 0x1d;
    if (uVar6 < 0x1d) {
      uVar2 = uVar6;
    }
    if (uVar6 < 0x1d) {
      pCVar4 = this;
    }
    if ((CScript *)((pCVar4->super_CScriptBase)._union.direct + (int)uVar2) <= local_40.ptr) break;
    bVar1 = GetOp(this,&local_40,&local_44);
    if (!bVar1) break;
    if ((local_44 & 0xfffffffe) == OP_CHECKMULTISIG) {
      if ((fAccurate) && (opcode_00 - OP_1 < 0x10)) {
        iVar3 = DecodeOP_N(opcode_00);
        uVar5 = uVar5 + iVar3;
      }
      else {
        uVar5 = uVar5 + 0x14;
      }
    }
    else if ((local_44 & 0xfffffffe) == OP_CHECKSIG) {
      uVar5 = uVar5 + 1;
    }
    uVar6 = (this->super_CScriptBase)._size;
    pCVar4 = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
    opcode_00 = local_44;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar5;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int CScript::GetSigOpCount(bool fAccurate) const
{
    unsigned int n = 0;
    const_iterator pc = begin();
    opcodetype lastOpcode = OP_INVALIDOPCODE;
    while (pc < end())
    {
        opcodetype opcode;
        if (!GetOp(pc, opcode))
            break;
        if (opcode == OP_CHECKSIG || opcode == OP_CHECKSIGVERIFY)
            n++;
        else if (opcode == OP_CHECKMULTISIG || opcode == OP_CHECKMULTISIGVERIFY)
        {
            if (fAccurate && lastOpcode >= OP_1 && lastOpcode <= OP_16)
                n += DecodeOP_N(lastOpcode);
            else
                n += MAX_PUBKEYS_PER_MULTISIG;
        }
        lastOpcode = opcode;
    }
    return n;
}